

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BringWindowToFocusFront(ImGuiWindow_conflict *window)

{
  short sVar1;
  ImGuiWindow_conflict *pIVar2;
  ImGuiWindow_conflict **ppIVar3;
  int i;
  ImVector<ImGuiWindow_*>_conflict *this;
  int i_00;
  bool bVar4;
  
  if (window->RootWindow != window) {
    __assert_fail("window == window->RootWindow",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x1b4e,"void ImGui::BringWindowToFocusFront(ImGuiWindow *)");
  }
  sVar1 = window->FocusOrder;
  this = &GImGui->WindowsFocusOrder;
  ppIVar3 = ImVector<ImGuiWindow_*>::operator[]((ImVector<ImGuiWindow_*> *)this,(int)sVar1);
  if (*ppIVar3 == window) {
    ppIVar3 = ImVector<ImGuiWindow_*>::back((ImVector<ImGuiWindow_*> *)this);
    if (*ppIVar3 != window) {
      i = this->Size + -1;
      i_00 = (int)sVar1;
      while (i_00 < i) {
        ppIVar3 = ImVector<ImGuiWindow_*>::operator[]((ImVector<ImGuiWindow_*> *)this,i_00 + 1);
        pIVar2 = *ppIVar3;
        ppIVar3 = ImVector<ImGuiWindow_*>::operator[]((ImVector<ImGuiWindow_*> *)this,i_00);
        *ppIVar3 = pIVar2;
        ppIVar3 = ImVector<ImGuiWindow_*>::operator[]((ImVector<ImGuiWindow_*> *)this,i_00);
        (*ppIVar3)->FocusOrder = (*ppIVar3)->FocusOrder + -1;
        ppIVar3 = ImVector<ImGuiWindow_*>::operator[]((ImVector<ImGuiWindow_*> *)this,i_00);
        bVar4 = i_00 != (*ppIVar3)->FocusOrder;
        i_00 = i_00 + 1;
        if (bVar4) {
          __assert_fail("g.WindowsFocusOrder[n]->FocusOrder == n",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                        ,0x1b5a,"void ImGui::BringWindowToFocusFront(ImGuiWindow *)");
        }
      }
      ppIVar3 = ImVector<ImGuiWindow_*>::operator[]((ImVector<ImGuiWindow_*> *)this,i);
      *ppIVar3 = window;
      window->FocusOrder = (short)i;
    }
    return;
  }
  __assert_fail("g.WindowsFocusOrder[cur_order] == window",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x1b51,"void ImGui::BringWindowToFocusFront(ImGuiWindow *)");
}

Assistant:

void ImGui::BringWindowToFocusFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == window->RootWindow);

    const int cur_order = window->FocusOrder;
    IM_ASSERT(g.WindowsFocusOrder[cur_order] == window);
    if (g.WindowsFocusOrder.back() == window)
        return;

    const int new_order = g.WindowsFocusOrder.Size - 1;
    for (int n = cur_order; n < new_order; n++)
    {
        g.WindowsFocusOrder[n] = g.WindowsFocusOrder[n + 1];
        g.WindowsFocusOrder[n]->FocusOrder--;
        IM_ASSERT(g.WindowsFocusOrder[n]->FocusOrder == n);
    }
    g.WindowsFocusOrder[new_order] = window;
    window->FocusOrder = (short)new_order;
}